

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O3

int __thiscall spdlog::details::file_helper::close(file_helper *this,int __fd)

{
  int in_EAX;
  FILE *__stream;
  FILE *local_10;
  
  __stream = (FILE *)this->fd_;
  if (__stream != (FILE *)0x0) {
    if ((this->event_handlers_).before_close.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      local_10 = __stream;
      (*(this->event_handlers_).before_close._M_invoker)
                ((_Any_data *)&(this->event_handlers_).before_close,&this->filename_,
                 (_IO_FILE **)&local_10);
      __stream = (FILE *)this->fd_;
    }
    in_EAX = fclose(__stream);
    this->fd_ = (FILE *)0x0;
    if ((this->event_handlers_).after_close.super__Function_base._M_manager != (_Manager_type)0x0) {
      in_EAX = (*(this->event_handlers_).after_close._M_invoker)
                         ((_Any_data *)&(this->event_handlers_).after_close,&this->filename_);
    }
  }
  return in_EAX;
}

Assistant:

SPDLOG_INLINE void file_helper::close() {
    if (fd_ != nullptr) {
        if (event_handlers_.before_close) {
            event_handlers_.before_close(filename_, fd_);
        }

        std::fclose(fd_);
        fd_ = nullptr;

        if (event_handlers_.after_close) {
            event_handlers_.after_close(filename_);
        }
    }
}